

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O1

void grd_spdopsi(grd_st_t *grd_st,seq_t *seq)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mdl_t *pmVar4;
  double *r;
  double *pdVar5;
  double *r_00;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t y;
  ulong uVar11;
  ulong uVar12;
  uint32_t nnz;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t N;
  double dVar16;
  
  pmVar4 = grd_st->mdl;
  r = grd_st->psi;
  pdVar5 = pmVar4->theta;
  uVar1 = pmVar4->nlbl;
  uVar9 = (ulong)uVar1;
  uVar2 = seq->len;
  uVar10 = (ulong)uVar2;
  r_00 = grd_st->psiuni;
  puVar6 = grd_st->psiyp;
  puVar7 = grd_st->psiidx;
  puVar8 = grd_st->psioff;
  if (uVar10 != 0) {
    uVar11 = 0;
    do {
      if (uVar9 != 0) {
        uVar3 = *(uint *)&seq[uVar11 * 2 + 1].field_0x4;
        uVar14 = 0;
        do {
          if ((ulong)uVar3 == 0) {
            dVar16 = 0.0;
          }
          else {
            dVar16 = 0.0;
            uVar12 = 0;
            do {
              dVar16 = dVar16 + pdVar5[uVar14 + pmVar4->uoff
                                                [*(long *)(*(long *)(seq + uVar11 * 2 + 2) +
                                                          uVar12 * 8)]];
              uVar12 = uVar12 + 1;
            } while (uVar3 != uVar12);
          }
          r_00[uVar11 * uVar9 + uVar14] = dVar16;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar9);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  N = 0;
  if (1 < uVar2) {
    uVar11 = 1;
    do {
      puVar8[uVar11] = (uint32_t)N;
      if (uVar9 != 0) {
        uVar14 = 0;
        uVar13 = 0;
        do {
          uVar12 = 0;
          do {
            if ((ulong)*(uint *)&seq[uVar11 * 2 + 1].raw == 0) {
              dVar16 = 0.0;
            }
            else {
              dVar16 = 0.0;
              uVar15 = 0;
              do {
                dVar16 = dVar16 + pdVar5[uVar14 + (ulong)((uint32_t)uVar12 * uVar1) +
                                                  pmVar4->boff[seq[uVar11 * 2 + 2].raw[uVar15]]];
                uVar15 = uVar15 + 1;
              } while (*(uint *)&seq[uVar11 * 2 + 1].raw != uVar15);
            }
            if ((dVar16 != 0.0) || (NAN(dVar16))) {
              puVar6[N] = (uint32_t)uVar12;
              r[N] = dVar16;
              uVar13 = uVar13 + 1;
              N = (uint64_t)((int)N + 1);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar9);
          puVar7[uVar11 * uVar9 + uVar14] = uVar13;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar9);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  xvm_expma(r_00,r_00,0.0,uVar10 * uVar9);
  xvm_expma(r,r,1.0,N);
  return;
}

Assistant:

void grd_spdopsi(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const double  *x = mdl->theta;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	double   (*psiuni)[T][Y] = (void *)grd_st->psiuni;
	double    *psival        =         grd_st->psi;
	uint32_t  *psiyp         =         grd_st->psiyp;
	uint32_t (*psiidx)[T][Y] = (void *)grd_st->psiidx;
	uint32_t  *psioff        =         grd_st->psioff;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double sum = 0.0;
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				sum += x[mdl->uoff[o] + y];
			}
			(*psiuni)[t][y] = sum;
		}
	}
	uint32_t off = 0;
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		psioff[t] = off;
		for (uint32_t y = 0, nnz = 0; y < Y; y++) {
			for (uint32_t yp = 0; yp < Y; yp++) {
				double sum = 0.0;
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					sum += x[mdl->boff[o] + yp * Y + y];
				}
				if (sum == 0.0)
					continue;
				psiyp [off] = yp;
				psival[off] = sum;
				nnz++, off++;
			}
			(*psiidx)[t][y] = nnz;
		}
	}
	xvm_expma((double *)psiuni, (double *)psiuni, 0.0, (uint64_t)T * Y);
	xvm_expma((double *)psival, (double *)psival, 1.0, off);
}